

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBucket::Verify(LargeHeapBucket *this)

{
  Recycler *recycler;
  LargeHeapBlock *pLVar1;
  LargeHeapBlock **ppLVar2;
  
  recycler = ((this->super_HeapBucket).heapInfo)->recycler;
  ppLVar2 = &this->largeBlockList;
  while (pLVar1 = *ppLVar2, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::Verify(pLVar1,recycler);
    ppLVar2 = &pLVar1->next;
  }
  ppLVar2 = &this->largePageHeapBlockList;
  while (pLVar1 = *ppLVar2, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::Verify(pLVar1,recycler);
    ppLVar2 = &pLVar1->next;
  }
  ppLVar2 = &this->fullLargeBlockList;
  while (pLVar1 = *ppLVar2, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::Verify(pLVar1,recycler);
    ppLVar2 = &pLVar1->next;
  }
  ppLVar2 = &this->pendingDisposeLargeBlockList;
  while (pLVar1 = *ppLVar2, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::Verify(pLVar1,recycler);
    ppLVar2 = &pLVar1->next;
  }
  return;
}

Assistant:

void
LargeHeapBucket::Verify()
{
    Recycler * recycler = this->heapInfo->recycler;
    HeapBlockList::ForEach(largeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
#ifdef RECYCLER_PAGE_HEAP
    HeapBlockList::ForEach(largePageHeapBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
#endif
    HeapBlockList::ForEach(fullLargeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
}